

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::HydroProp::getPitchMatrix(HydroProp *this)

{
  SquareMatrix<double,_3> *in_RDI;
  Mat3x3d *P;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffe08;
  SquareMatrix<double,_3> *this_00;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffe28;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffe30;
  HydroProp *in_stack_fffffffffffffe38;
  SquareMatrix3<double> *in_stack_fffffffffffffea8;
  RectMatrix<double,_3U,_3U> local_f0;
  RectMatrix<double,_3U,_3U> local_a8 [2];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3e557e);
  getXitt(in_stack_fffffffffffffe38);
  SquareMatrix3<double>::inverse(in_stack_fffffffffffffea8);
  OpenMD::operator-(in_stack_fffffffffffffe28);
  getXirt(in_stack_fffffffffffffe38);
  OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30);
  SquareMatrix<double,_3>::SquareMatrix(in_RDI,in_stack_fffffffffffffe08);
  SquareMatrix3<double>::operator=((SquareMatrix3<double> *)this_00,in_RDI);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x3e561f);
  RectMatrix<double,_3U,_3U>::~RectMatrix(local_a8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3e5636);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_f0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3e5650);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3e565a);
  return (Mat3x3d *)this_00;
}

Assistant:

Mat3x3d HydroProp::getPitchMatrix() {
    Mat3x3d P;
    P = -getXitt().inverse() * getXirt();
    return P;
  }